

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O3

void row_mt_mem_alloc(AV1_COMP *cpi,int max_rows,int max_cols,int alloc_row_ctx)

{
  byte bVar1;
  uint uVar2;
  TileDataEnc *pTVar3;
  void *pvVar4;
  int *piVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long local_58;
  
  uVar2 = (cpi->common).tiles.cols;
  lVar8 = (long)(cpi->common).tiles.rows;
  av1_row_mt_mem_dealloc(cpi);
  if (0 < lVar8) {
    iVar7 = 2;
    if (2 < max_cols) {
      iVar7 = max_cols;
    }
    local_58 = 0x5cd8;
    lVar6 = 0;
    do {
      uVar9 = (ulong)uVar2;
      lVar10 = local_58;
      if (0 < (int)uVar2) {
        do {
          pTVar3 = cpi->tile_data;
          row_mt_sync_mem_alloc
                    ((AV1EncRowMultiThreadSync *)
                     ((long)((pTVar3->tctx).txb_skip_cdf + -1) + 0x2e + lVar10),&cpi->common,
                     max_rows);
          if (alloc_row_ctx != 0) {
            pvVar4 = aom_memalign(0x10,(ulong)(iVar7 - 1) * 0x52fc);
            *(void **)((long)pTVar3 + lVar10 + -0x9b8) = pvVar4;
            if (pvVar4 == (void *)0x0) {
              aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate this_tile->row_ctx");
            }
          }
          uVar9 = uVar9 - 1;
          lVar10 = lVar10 + 0x5d10;
        } while (uVar9 != 0);
      }
      lVar6 = lVar6 + 1;
      local_58 = local_58 + (ulong)uVar2 * 0x5d10;
    } while (lVar6 != lVar8);
  }
  bVar1 = (byte)((cpi->common).seq_params)->mib_size_log2;
  iVar7 = (cpi->common).mi_params.mi_rows + (1 << (bVar1 & 0x1f)) + -1 >> (bVar1 & 0x1f);
  piVar5 = (int *)aom_malloc((long)iVar7 << 2);
  (cpi->mt_info).enc_row_mt.num_tile_cols_done = piVar5;
  if (piVar5 == (int *)0x0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                       "Failed to allocate enc_row_mt->num_tile_cols_done");
  }
  (cpi->mt_info).enc_row_mt.allocated_rows = max_rows;
  (cpi->mt_info).enc_row_mt.allocated_cols = max_cols + -1;
  (cpi->mt_info).enc_row_mt.allocated_sb_rows = iVar7;
  return;
}

Assistant:

static void row_mt_mem_alloc(AV1_COMP *cpi, int max_rows, int max_cols,
                             int alloc_row_ctx) {
  struct AV1Common *cm = &cpi->common;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &cpi->mt_info.enc_row_mt;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  int tile_col, tile_row;

  av1_row_mt_mem_dealloc(cpi);

  // Allocate memory for row based multi-threading
  for (tile_row = 0; tile_row < tile_rows; tile_row++) {
    for (tile_col = 0; tile_col < tile_cols; tile_col++) {
      int tile_index = tile_row * tile_cols + tile_col;
      TileDataEnc *const this_tile = &cpi->tile_data[tile_index];

      row_mt_sync_mem_alloc(&this_tile->row_mt_sync, cm, max_rows);

      if (alloc_row_ctx) {
        assert(max_cols > 0);
        const int num_row_ctx = AOMMAX(1, (max_cols - 1));
        CHECK_MEM_ERROR(cm, this_tile->row_ctx,
                        (FRAME_CONTEXT *)aom_memalign(
                            16, num_row_ctx * sizeof(*this_tile->row_ctx)));
      }
    }
  }
  const int sb_rows = get_sb_rows_in_frame(cm);
  CHECK_MEM_ERROR(
      cm, enc_row_mt->num_tile_cols_done,
      aom_malloc(sizeof(*enc_row_mt->num_tile_cols_done) * sb_rows));

  enc_row_mt->allocated_rows = max_rows;
  enc_row_mt->allocated_cols = max_cols - 1;
  enc_row_mt->allocated_sb_rows = sb_rows;
}